

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix.hpp
# Opt level: O3

SquareMatrix<std::complex<float>_> __thiscall
qclab::dense::operator-
          (dense *this,SquareMatrix<std::complex<float>_> *lhs,
          SquareMatrix<std::complex<float>_> *rhs)

{
  _ComplexT _Var1;
  _ComplexT _Var2;
  complex<float> *pcVar3;
  long lVar4;
  long lVar5;
  data_type extraout_RDX;
  long lVar6;
  long lVar7;
  SquareMatrix<std::complex<float>_> SVar8;
  
  lVar4 = rhs->size_;
  if (lVar4 == lhs->size_) {
    if (0 < lVar4) {
      lVar5 = 0;
      lVar6 = 0;
      do {
        if (0 < lVar4) {
          lVar7 = 0;
          do {
            pcVar3 = (lhs->data_)._M_t.
                     super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                     .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
            _Var1 = *(_ComplexT *)
                     ((long)&(rhs->data_)._M_t.
                             super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                             .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl
                             [lVar7]._M_value + rhs->size_ * lVar5);
            _Var2 = *(_ComplexT *)((long)&pcVar3[lVar7]._M_value + lVar4 * lVar5);
            *(_ComplexT *)((long)&pcVar3[lVar7]._M_value + lVar4 * lVar5) =
                 CONCAT44((float)(_Var2 >> 0x20) - (float)(_Var1 >> 0x20),
                          (float)_Var2 - (float)_Var1);
            lVar7 = lVar7 + 1;
            lVar4 = lhs->size_;
          } while (lVar7 < lVar4);
        }
        lVar6 = lVar6 + 1;
        lVar5 = lVar5 + 8;
      } while (lVar6 < lVar4);
    }
    SquareMatrix<std::complex<float>_>::SquareMatrix((SquareMatrix<std::complex<float>_> *)this,lhs)
    ;
    SVar8.data_._M_t.
    super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
    super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
    super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl =
         extraout_RDX._M_t.
         super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>.
         _M_t.
         super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
         super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
    SVar8.size_ = (size_type_conflict)this;
    return SVar8;
  }
  __assert_fail("rhs.size() == size_",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/dense/SquareMatrix.hpp"
                ,0xa4,
                "SquareMatrix<T> &qclab::dense::SquareMatrix<std::complex<float>>::operator-=(const SquareMatrix<T> &) [T = std::complex<float>]"
               );
}

Assistant:

inline int64_t rows() const { return size_ ; }